

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall World::AdminRequest(World *this,Character *from,string *message)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Character *pCVar4;
  World *pWVar5;
  World *pWVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  mapped_type *pmVar11;
  undefined8 *puVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  long *plVar15;
  _List_node_base *p_Var16;
  size_type *psVar17;
  Board *pBVar18;
  undefined8 uVar19;
  PacketBuilder builder;
  key_type local_128;
  Board *local_108;
  string local_100;
  Character *local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  World *local_78;
  string *local_70;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_68;
  undefined1 local_60 [48];
  
  paVar2 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar2;
  local_e0 = from;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ChatMaxWidth","");
  pmVar11 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&local_128);
  iVar8 = util::variant::GetInt(pmVar11);
  (*(local_e0->super_Command_Source)._vptr_Command_Source[2])(&local_d8);
  util::ucfirst(&local_98,&local_d8);
  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  psVar17 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_100.field_2._M_allocated_capacity = *psVar17;
    local_100.field_2._8_8_ = puVar12[3];
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar17;
    local_100._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_100._M_string_length = puVar12[1];
  *puVar12 = psVar17;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  iVar9 = util::text_width(&local_100);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"...","");
  util::text_cap((string *)local_60,message,iVar8 - iVar9,&local_b8);
  std::__cxx11::string::operator=((string *)message,(string *)local_60);
  pCVar4 = local_e0;
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  (*(pCVar4->super_Command_Source)._vptr_Command_Source[2])(&local_128,pCVar4);
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_60,PACKET_ADMININTERACT,PACKET_REPLY,
             message->_M_string_length + local_128._M_string_length + 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  PacketBuilder::AddChar((PacketBuilder *)local_60,1);
  PacketBuilder::AddByte((PacketBuilder *)local_60,0xff);
  (*(pCVar4->super_Command_Source)._vptr_Command_Source[2])(&local_128,pCVar4);
  PacketBuilder::AddBreakString((PacketBuilder *)local_60,&local_128,0xff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  PacketBuilder::AddBreakString((PacketBuilder *)local_60,message,0xff);
  pBVar18 = (Board *)(this->characters).
                     super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
  local_108 = (Board *)(this->characters).
                       super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  local_78 = this;
  local_70 = message;
  if (pBVar18 != local_108) {
    local_68 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->admin_config;
    do {
      pCVar4 = *(Character **)pBVar18;
      uVar10 = (**(pCVar4->super_Command_Source)._vptr_Command_Source)(pCVar4);
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"reports","");
      pmVar11 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_68,&local_128);
      iVar8 = util::variant::GetInt(pmVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (iVar8 <= (int)(uVar10 & 0xff)) {
        Character::Send(pCVar4,(PacketBuilder *)local_60);
      }
      pBVar18 = (Board *)&pBVar18->posts;
    } while (pBVar18 != local_108);
  }
  pWVar6 = local_78;
  pWVar5 = local_78->server->world;
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"AdminBoard","");
  pmVar11 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar5->config,&local_128);
  paVar3 = &local_98.field_2;
  iVar8 = util::variant::GetInt(pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  uVar13 = (ulong)(short)((short)iVar8 + -1);
  if (7 < uVar13) goto LAB_0019ac26;
  local_108 = (pWVar6->server->world->boards)._M_elems[uVar13];
  p_Var14 = (_List_node_base *)operator_new(0x78);
  p_Var14->_M_prev = (_List_node_base *)&p_Var14[1]._M_prev;
  p_Var14[1]._M_next = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var14[1]._M_prev = 0;
  p_Var14[3]._M_next = p_Var14 + 4;
  p_Var14[3]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var14[4]._M_next = 0;
  p_Var14[5]._M_next = p_Var14 + 6;
  p_Var14[5]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var14[6]._M_next = 0;
  sVar7 = (short)*(undefined4 *)&local_108->last_id + 1;
  local_108->last_id = sVar7;
  *(short *)&p_Var14->_M_next = sVar7;
  (*(local_e0->super_Command_Source)._vptr_Command_Source[2])(&local_128);
  std::__cxx11::string::operator=((string *)&p_Var14->_M_prev,(string *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  pCVar4 = local_e0;
  *(uint *)&p_Var14[2]._M_prev = (uint)local_e0->admin;
  local_98._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [Request] ","");
  (*(pCVar4->super_Command_Source)._vptr_Command_Source[2])(&local_b8,pCVar4);
  util::ucfirst(&local_d8,&local_b8);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar3) {
    uVar19 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_d8._M_string_length + local_98._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar19 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_d8._M_string_length + local_98._M_string_length) goto LAB_0019a9ff;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_d8,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
  }
  else {
LAB_0019a9ff:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
  }
  psVar17 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_100.field_2._M_allocated_capacity = *psVar17;
    local_100.field_2._8_8_ = puVar12[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar17;
    local_100._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_100._M_string_length = puVar12[1];
  *puVar12 = psVar17;
  puVar12[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar17 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_128.field_2._M_allocated_capacity = *psVar17;
    local_128.field_2._8_8_ = plVar15[3];
    local_128._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar17;
    local_128._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_128._M_string_length = plVar15[1];
  *plVar15 = (long)psVar17;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::operator=((string *)(p_Var14 + 3),(string *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar3) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)(p_Var14 + 5));
  p_Var16 = (_List_node_base *)Timer::GetTime();
  p_Var14[7]._M_next = p_Var16;
  p_Var16 = (_List_node_base *)operator_new(0x18);
  p_Var16[1]._M_next = p_Var14;
  std::__detail::_List_node_base::_M_hook(p_Var16);
  uVar13 = (local_108->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
           _M_node._M_size + 1;
  (local_108->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl._M_node.
  _M_size = uVar13;
  pWVar5 = local_78->server->world;
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"AdminBoardLimit","");
  pmVar11 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar5->config,&local_128);
  iVar8 = util::variant::GetInt(pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((ulong)(long)iVar8 < uVar13) {
    p_Var14 = (local_108->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>.
              _M_impl._M_node.super__List_node_base._M_prev;
    psVar1 = &(local_108->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var14,0x18);
  }
LAB_0019ac26:
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
  return;
}

Assistant:

void World::AdminRequest(Character *from, std::string message)
{
	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  needs help: "));

	PacketBuilder builder(PACKET_ADMININTERACT, PACKET_REPLY, 4 + from->SourceName().length() + message.length());
	builder.AddChar(1); // message type
	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddBreakString(message);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceAccess() >= static_cast<int>(this->admin_config["reports"]))
		{
			character->Send(builder);
		}
	}

	short boardid = static_cast<int>(this->server->world->config["AdminBoard"]) - 1;

	if (static_cast<std::size_t>(boardid) < this->server->world->boards.size())
	{
		Board *admin_board = this->server->world->boards[boardid];

		Board_Post *newpost = new Board_Post;
		newpost->id = ++admin_board->last_id;
		newpost->author = from->SourceName();
		newpost->author_admin = from->admin;
		newpost->subject = std::string(" [Request] ") + util::ucfirst(from->SourceName()) + " needs help";
		newpost->body = message;
		newpost->time = Timer::GetTime();

		admin_board->posts.push_front(newpost);

		if (admin_board->posts.size() > static_cast<std::size_t>(static_cast<int>(this->server->world->config["AdminBoardLimit"])))
		{
			admin_board->posts.pop_back();
		}
	}
}